

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O2

bool __thiscall Jinx::Variant::IsKeyType(Variant *this)

{
  return (bool)((byte)(0x81e >> ((byte)this->m_type & 0x1f)) & this->m_type < ValType);
}

Assistant:

inline_t bool Variant::IsKeyType() const
	{
		switch (m_type)
		{
			case ValueType::Number:
			case ValueType::Integer:
			case ValueType::Boolean:
			case ValueType::String:
			case ValueType::Guid:
				return true;
			default:
				break;
		};
		return false;
	}